

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall punky::lex::Lexer::next_token(Token *__return_storage_ptr__,Lexer *this)

{
  char ch;
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  char *pcVar4;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var5;
  string *this_00;
  long lVar6;
  undefined1 local_4fb;
  undefined1 local_4fa;
  undefined1 local_4f9;
  Token tok;
  TokenType local_4c4 [7];
  undefined1 local_4a8 [80];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_458;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_430;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_408;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
  local_3b8;
  string ident;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_348;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_280;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_258;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_230;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  skip_whitespace(this);
  tok.m_type = LeftParen;
  tok.m_literal.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  ch = this->m_curr_char;
  switch(ch) {
  case '!':
    pcVar4 = (this->m_curr_it)._M_current + 1;
    if ((pcVar4 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) ||
       (*pcVar4 != '=')) {
      local_118._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,Bang,(TokenLiteral *)&local_118);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_118;
    }
    else {
      consume(this);
      local_f0._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,BangEqual,(TokenLiteral *)&local_f0);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_f0;
    }
    break;
  case '\"':
  case '#':
  case '$':
  case '%':
  case '&':
  case '\'':
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
switchD_00106648_caseD_22:
    bVar1 = utils::is_letter(ch);
    if (bVar1) {
      tokenize_identifier_abi_cxx11_(&ident,this);
      if ((token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_ == '\0') &&
         (iVar2 = __cxa_guard_acquire(&token_type(std::__cxx11::string_const&)::
                                       M_KEYWORDS_abi_cxx11_), iVar2 != 0)) {
        local_4c4[6] = 0x19;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)local_4a8,(char (*) [3])"fn",local_4c4 + 6);
        local_4c4[5] = 0x1a;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[4],_punky::tok::TokenType,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
                    *)(local_4a8 + 0x28),(char (*) [4])"let",local_4c4 + 5);
        local_4c4[4] = 0x1b;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_458,(char (*) [5])"true",local_4c4 + 4);
        local_4c4[3] = 0x1c;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[6],_punky::tok::TokenType,_true>
                  (&local_430,(char (*) [6])"false",local_4c4 + 3);
        local_4c4[2] = 0x1d;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[3],_punky::tok::TokenType,_true>
                  (&local_408,(char (*) [3])"if",local_4c4 + 2);
        local_4c4[1] = 0x1e;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[5],_punky::tok::TokenType,_true>
                  (&local_3e0,(char (*) [5])"else",local_4c4 + 1);
        local_4c4[0] = Return;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>
        ::pair<const_char_(&)[7],_punky::tok::TokenType,_true>
                  (&local_3b8,(char (*) [7])"return",local_4c4);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,punky::tok::TokenType>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,punky::tok::TokenType>,std::allocator<std::pair<std::__cxx11::string_const,punky::tok::TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,local_4a8,
                   &ident,0,&local_4f9,&local_4fa,&local_4fb);
        lVar6 = 0xf0;
        do {
          std::__cxx11::string::~string((string *)(local_4a8 + lVar6));
          lVar6 = lVar6 + -0x28;
        } while (lVar6 != -0x28);
        __cxa_atexit(std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>_>
                     ::~unordered_map,token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_
                     ,&__dso_handle);
        __cxa_guard_release(&token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_);
      }
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)token_type(std::__cxx11::string_const&)::M_KEYWORDS_abi_cxx11_,&ident);
      if ((cVar3.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
           ._M_cur == (__node_type *)0x0) ||
         (*(TokenType *)
           ((long)cVar3.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
                  ._M_cur + 0x28) == Identifier)) {
        p_Var5 = &local_50;
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)p_Var5,&ident);
        punky::tok::make_token(__return_storage_ptr__,Identifier,(TokenLiteral *)p_Var5);
      }
      else {
        p_Var5 = &local_78;
        local_78._M_engaged = false;
        punky::tok::make_token
                  (__return_storage_ptr__,
                   *(TokenType *)
                    ((long)cVar3.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_punky::tok::TokenType>,_true>
                           ._M_cur + 0x28),(TokenLiteral *)p_Var5);
      }
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(p_Var5);
      this_00 = &ident;
    }
    else {
      bVar1 = utils::is_digit(this->m_curr_char);
      if (!bVar1) {
        local_370._M_engaged = false;
        punky::tok::make_token((Token *)local_4a8,Illegal,(TokenLiteral *)&local_370);
        punky::tok::Token::operator=(&tok,(Token *)local_4a8);
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(local_4a8 + 8));
        p_Var5 = &local_370;
        break;
      }
      tokenize_integer_abi_cxx11_((string *)local_4a8,this);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a8);
      punky::tok::make_token(__return_storage_ptr__,Int,(TokenLiteral *)&local_348);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_348);
      this_00 = (string *)local_4a8;
    }
    std::__cxx11::string::~string((string *)this_00);
    goto LAB_00106bef;
  case '(':
    local_258._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,LeftParen,(TokenLiteral *)&local_258);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_258;
    break;
  case ')':
    local_280._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,RightParen,(TokenLiteral *)&local_280);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_280;
    break;
  case '*':
    local_1b8._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Asterisk,(TokenLiteral *)&local_1b8);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_1b8;
    break;
  case '+':
    local_140._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Plus,(TokenLiteral *)&local_140);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_140;
    break;
  case ',':
    local_2a8._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Comma,(TokenLiteral *)&local_2a8);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_2a8;
    break;
  case '-':
    local_168._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Minus,(TokenLiteral *)&local_168);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_168;
    break;
  case '/':
    local_190._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Slash,(TokenLiteral *)&local_190);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_190;
    break;
  case ';':
    local_230._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Semicolon,(TokenLiteral *)&local_230);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_230;
    break;
  case '<':
    local_1e0._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Less,(TokenLiteral *)&local_1e0);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_1e0;
    break;
  case '=':
    pcVar4 = (this->m_curr_it)._M_current + 1;
    if ((pcVar4 == (this->m_line)._M_dataplus._M_p + (this->m_line)._M_string_length) ||
       (*pcVar4 != '=')) {
      local_c8._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,Equal,(TokenLiteral *)&local_c8);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_c8;
    }
    else {
      consume(this);
      local_a0._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,EqualEqual,(TokenLiteral *)&local_a0);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_a0;
    }
    break;
  case '>':
    local_208._M_engaged = false;
    punky::tok::make_token((Token *)local_4a8,Greater,(TokenLiteral *)&local_208);
    punky::tok::Token::operator=(&tok,(Token *)local_4a8);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(local_4a8 + 8));
    p_Var5 = &local_208;
    break;
  default:
    if (ch == '\0') {
      local_320._M_engaged = false;
      punky::tok::make_token(__return_storage_ptr__,EOS,(TokenLiteral *)&local_320);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset(&local_320);
      goto LAB_00106bef;
    }
    if (ch == '{') {
      local_2d0._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,LeftBrace,(TokenLiteral *)&local_2d0);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_2d0;
    }
    else {
      if (ch != '}') goto switchD_00106648_caseD_22;
      local_2f8._M_engaged = false;
      punky::tok::make_token((Token *)local_4a8,RightBrace,(TokenLiteral *)&local_2f8);
      punky::tok::Token::operator=(&tok,(Token *)local_4a8);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_4a8 + 8));
      p_Var5 = &local_2f8;
    }
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(p_Var5);
  consume(this);
  punky::tok::Token::Token(__return_storage_ptr__,&tok);
LAB_00106bef:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&tok.m_literal);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::next_token()
{
    skip_whitespace();

    auto tok = Token{};
    switch (m_curr_char)
    {
        case '=':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::EqualEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Equal, std::nullopt);
            break;
        case '!':
            if (peek().has_value() && peek().value() == '=')
            {
                consume();
                tok = make_token(TokenType::BangEqual, std::nullopt);
            }
            else
                tok = make_token(TokenType::Bang, std::nullopt);
            break;
        // clang-format off
        case '+': tok = make_token(TokenType::Plus, std::nullopt); break;
        case '-': tok = make_token(TokenType::Minus, std::nullopt); break;
        case '/': tok = make_token(TokenType::Slash, std::nullopt); break;
        case '*': tok = make_token(TokenType::Asterisk, std::nullopt); break;
        case '<': tok = make_token(TokenType::Less, std::nullopt); break;
        case '>': tok = make_token(TokenType::Greater, std::nullopt); break;
        case ';': tok = make_token(TokenType::Semicolon, std::nullopt); break;
        case '(': tok = make_token(TokenType::LeftParen, std::nullopt); break;
        case ')': tok = make_token(TokenType::RightParen, std::nullopt); break;
        case ',': tok = make_token(TokenType::Comma, std::nullopt); break;
        case '{': tok = make_token(TokenType::LeftBrace, std::nullopt); break;
        case '}': tok = make_token(TokenType::RightBrace, std::nullopt); break;
        case  0 : return make_token(TokenType::EOS, std::nullopt);
        // clang-format on
        default:
            if (utils::is_letter(m_curr_char))
            {
                auto       ident = tokenize_identifier();
                const auto type  = token_type(ident);
                return type == TokenType::Identifier ? make_token(type, std::move(ident))
                                                     : make_token(type, std::nullopt);
            }
            else if (utils::is_digit(m_curr_char))
                return make_token(TokenType::Int, tokenize_integer());
            else
                tok = make_token(TokenType::Illegal, std::nullopt);
            break;
    }

    consume();
    return tok;
}